

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O1

VkFramebuffer __thiscall
Diligent::FramebufferCache::GetFramebuffer
          (FramebufferCache *this,FramebufferCacheKey *Key,uint32_t width,uint32_t height,
          uint32_t layers)

{
  uint uVar1;
  VkImageView pVVar2;
  int iVar3;
  iterator iVar4;
  long lVar5;
  ulong uVar6;
  VkImageView *ppVVar7;
  FramebufferCacheKey *pFVar8;
  ulong uVar9;
  string *psVar10;
  VkFramebuffer pVVar11;
  byte bVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_false,_true>,_bool>
  pVar13;
  FramebufferWrapper Framebuffer;
  VkFramebufferCreateInfo FramebufferCI;
  string msg;
  array<VkImageView_T_*,_10UL> Attachments;
  FramebufferWrapper local_160;
  VkFramebufferCreateInfo local_148;
  string local_108 [3];
  VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13> local_98;
  VkImageView local_80 [10];
  
  bVar12 = 0;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar3 == 0) {
    iVar4 = std::
            _Hashtable<Diligent::FramebufferCache::FramebufferCacheKey,_std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->m_Cache)._M_h,Key);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_148.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
      local_148._4_4_ = 0;
      local_148.pNext = (void *)0x0;
      local_148.flags = 0;
      local_148._20_4_ = 0;
      local_148.renderPass = Key->Pass;
      pVVar2 = Key->DSV;
      if (pVVar2 != (VkImageView)0x0) {
        local_80[0] = pVVar2;
      }
      uVar1 = Key->NumRenderTargets;
      local_148.attachmentCount = (uint32_t)(pVVar2 != (VkImageView)0x0);
      if ((ulong)uVar1 != 0) {
        uVar6 = 0;
        do {
          if (Key->RTVs[uVar6] != (VkImageView)0x0) {
            uVar9 = (ulong)local_148.attachmentCount;
            local_148.attachmentCount = local_148.attachmentCount + 1;
            local_80[uVar9] = Key->RTVs[uVar6];
          }
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      if (Key->ShadingRate != (VkImageView)0x0) {
        uVar6 = (ulong)local_148.attachmentCount;
        local_148.attachmentCount = local_148.attachmentCount + 1;
        local_80[uVar6] = Key->ShadingRate;
      }
      local_148._36_4_ = 0;
      local_148.pAttachments = local_80;
      local_148.height = height;
      local_148.width = width;
      local_148._60_4_ = 0;
      local_148.layers = layers;
      VulkanUtilities::VulkanLogicalDevice::CreateFramebuffer
                (&local_160,
                 (this->m_DeviceVk->m_LogicalVkDevice).
                 super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,&local_148,"");
      pVVar11 = local_160.m_VkObject;
      pFVar8 = Key;
      psVar10 = local_108;
      for (lVar5 = 0xe; lVar5 != 0; lVar5 = lVar5 + -1) {
        (psVar10->_M_dataplus)._M_p = (pointer)pFVar8->Pass;
        pFVar8 = (FramebufferCacheKey *)((long)pFVar8 + (ulong)bVar12 * -0x10 + 8);
        psVar10 = (string *)((long)psVar10 + ((ulong)bVar12 * -2 + 1) * 8);
      }
      local_98.m_pLogicalDevice.
      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_160.m_pLogicalDevice.
               super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_98.m_pLogicalDevice.
      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_160.m_pLogicalDevice.
           super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      local_160.m_pLogicalDevice.
      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_160.m_pLogicalDevice.
      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98.m_VkObject = local_160.m_VkObject;
      local_160.m_VkObject = (VkFramebuffer)0x0;
      pVar13 = std::
               _Hashtable<Diligent::FramebufferCache::FramebufferCacheKey,std::pair<Diligent::FramebufferCache::FramebufferCacheKey_const,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>,std::allocator<std::pair<Diligent::FramebufferCache::FramebufferCacheKey_const,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>>,std::__detail::_Select1st,std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,Diligent::FramebufferCache::FramebufferCacheKeyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::
               _M_emplace<std::pair<Diligent::FramebufferCache::FramebufferCacheKey,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>>
                         ((_Hashtable<Diligent::FramebufferCache::FramebufferCacheKey,std::pair<Diligent::FramebufferCache::FramebufferCacheKey_const,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>,std::allocator<std::pair<Diligent::FramebufferCache::FramebufferCacheKey_const,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>>,std::__detail::_Select1st,std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,Diligent::FramebufferCache::FramebufferCacheKeyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)&this->m_Cache,local_108);
      VulkanUtilities::
      VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>::
      ~VulkanObjectWrapper(&local_98);
      if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        FormatString<char[46]>
                  (local_108,(char (*) [46])"New framebuffer must be inserted into the map");
        DebugAssertionFailed
                  (local_108[0]._M_dataplus._M_p,"GetFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FramebufferCache.cpp"
                   ,0x7c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108[0]._M_dataplus._M_p != &local_108[0].field_2) {
          operator_delete(local_108[0]._M_dataplus._M_p,
                          local_108[0].field_2._M_allocated_capacity + 1);
        }
      }
      std::
      _Hashtable<VkRenderPass_T*,std::pair<VkRenderPass_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkRenderPass_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkRenderPass_T*>,std::hash<VkRenderPass_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
      ::_M_emplace<VkRenderPass_T*const&,Diligent::FramebufferCache::FramebufferCacheKey_const&>
                ((_Hashtable<VkRenderPass_T*,std::pair<VkRenderPass_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkRenderPass_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkRenderPass_T*>,std::hash<VkRenderPass_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                  *)&this->m_RenderPassToKeyMap,0,Key,Key);
      if (Key->DSV != (VkImageView)0x0) {
        std::
        _Hashtable<VkImageView_T*,std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkImageView_T*>,std::hash<VkImageView_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
        ::_M_emplace<VkImageView_T*const&,Diligent::FramebufferCache::FramebufferCacheKey_const&>
                  ((_Hashtable<VkImageView_T*,std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkImageView_T*>,std::hash<VkImageView_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                    *)&this->m_ViewToKeyMap,0,&Key->DSV,Key);
      }
      if (Key->ShadingRate != (VkImageView)0x0) {
        std::
        _Hashtable<VkImageView_T*,std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkImageView_T*>,std::hash<VkImageView_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
        ::_M_emplace<VkImageView_T*const&,Diligent::FramebufferCache::FramebufferCacheKey_const&>
                  ((_Hashtable<VkImageView_T*,std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkImageView_T*>,std::hash<VkImageView_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                    *)&this->m_ViewToKeyMap,0,&Key->ShadingRate,Key);
      }
      if (Key->NumRenderTargets != 0) {
        ppVVar7 = Key->RTVs;
        uVar6 = 0;
        do {
          if (*ppVVar7 != (VkImageView)0x0) {
            std::
            _Hashtable<VkImageView_T*,std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkImageView_T*>,std::hash<VkImageView_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
            ::
            _M_emplace<VkImageView_T*const&,Diligent::FramebufferCache::FramebufferCacheKey_const&>
                      ((_Hashtable<VkImageView_T*,std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkImageView_T*>,std::hash<VkImageView_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                        *)&this->m_ViewToKeyMap,0,ppVVar7,Key);
          }
          uVar6 = uVar6 + 1;
          ppVVar7 = ppVVar7 + 1;
        } while (uVar6 < Key->NumRenderTargets);
      }
      VulkanUtilities::
      VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>::
      ~VulkanObjectWrapper(&local_160);
    }
    else {
      pVVar11 = *(VkFramebuffer *)
                 ((long)iVar4.
                        super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
                        ._M_cur + 0x88);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    return pVVar11;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

VkFramebuffer FramebufferCache::GetFramebuffer(const FramebufferCacheKey& Key, uint32_t width, uint32_t height, uint32_t layers)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};

    auto it = m_Cache.find(Key);
    if (it != m_Cache.end())
    {
        return it->second;
    }
    else
    {
        VkFramebufferCreateInfo FramebufferCI{};
        FramebufferCI.sType      = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
        FramebufferCI.pNext      = nullptr;
        FramebufferCI.flags      = 0; // reserved for future use
        FramebufferCI.renderPass = Key.Pass;

        std::array<VkImageView, 2 + MAX_RENDER_TARGETS> Attachments;

        uint32_t& attachment = FramebufferCI.attachmentCount;
        if (Key.DSV != VK_NULL_HANDLE)
            Attachments[attachment++] = Key.DSV;

        for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
        {
            if (Key.RTVs[rt] != VK_NULL_HANDLE)
                Attachments[attachment++] = Key.RTVs[rt];
        }

        if (Key.ShadingRate != VK_NULL_HANDLE)
            Attachments[attachment++] = Key.ShadingRate;

        FramebufferCI.pAttachments = Attachments.data();
        FramebufferCI.width        = width;
        FramebufferCI.height       = height;
        FramebufferCI.layers       = layers;

        VulkanUtilities::FramebufferWrapper Framebuffer = m_DeviceVk.GetLogicalDevice().CreateFramebuffer(FramebufferCI);

        VkFramebuffer fb = Framebuffer;

        auto new_it = m_Cache.insert(std::make_pair(Key, std::move(Framebuffer)));
        VERIFY(new_it.second, "New framebuffer must be inserted into the map");
        (void)new_it;

        m_RenderPassToKeyMap.emplace(Key.Pass, Key);
        if (Key.DSV != VK_NULL_HANDLE)
            m_ViewToKeyMap.emplace(Key.DSV, Key);
        if (Key.ShadingRate != VK_NULL_HANDLE)
            m_ViewToKeyMap.emplace(Key.ShadingRate, Key);
        for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
            if (Key.RTVs[rt] != VK_NULL_HANDLE)
                m_ViewToKeyMap.emplace(Key.RTVs[rt], Key);

        return fb;
    }
}